

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

int32_t ucurr_getNumericCode_63(UChar *currency)

{
  UBool UVar1;
  int32_t iVar2;
  char local_24 [4];
  int tmpCode;
  char alphaCode [4];
  UResourceBundle *bundle;
  UErrorCode status;
  int32_t code;
  UChar *currency_local;
  
  bundle._4_4_ = 0;
  if ((currency != (UChar *)0x0) && (_status = currency, iVar2 = u_strlen_63(currency), iVar2 == 3))
  {
    bundle._0_4_ = U_ZERO_ERROR;
    _tmpCode = ures_openDirect_63((char *)0x0,"currencyNumericCodes",(UErrorCode *)&bundle);
    ures_getByKey_63(_tmpCode,"codeMap",_tmpCode,(UErrorCode *)&bundle);
    UVar1 = U_SUCCESS((UErrorCode)bundle);
    if (UVar1 != '\0') {
      myUCharsToChars(local_24,_status);
      T_CString_toUpperCase_63(local_24);
      ures_getByKey_63(_tmpCode,local_24,_tmpCode,(UErrorCode *)&bundle);
      iVar2 = ures_getInt_63(_tmpCode,(UErrorCode *)&bundle);
      UVar1 = U_SUCCESS((UErrorCode)bundle);
      if (UVar1 != '\0') {
        bundle._4_4_ = iVar2;
      }
    }
    ures_close_63(_tmpCode);
  }
  return bundle._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucurr_getNumericCode(const UChar* currency) {
    int32_t code = 0;
    if (currency && u_strlen(currency) == ISO_CURRENCY_CODE_LENGTH) {
        UErrorCode status = U_ZERO_ERROR;

        UResourceBundle *bundle = ures_openDirect(0, "currencyNumericCodes", &status);
        ures_getByKey(bundle, "codeMap", bundle, &status);
        if (U_SUCCESS(status)) {
            char alphaCode[ISO_CURRENCY_CODE_LENGTH+1];
            myUCharsToChars(alphaCode, currency);
            T_CString_toUpperCase(alphaCode);
            ures_getByKey(bundle, alphaCode, bundle, &status);
            int tmpCode = ures_getInt(bundle, &status);
            if (U_SUCCESS(status)) {
                code = tmpCode;
            }
        }
        ures_close(bundle);
    }
    return code;
}